

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaParams.cpp
# Opt level: O3

bool __thiscall NaParams::CheckParam(NaParams *this,char *szParamName)

{
  void *pvVar1;
  item_t it;
  char *local_10;
  undefined8 local_8;
  
  local_8 = 0;
  local_10 = szParamName;
  pvVar1 = bsearch(&local_10,this->storage,(long)this->stored_n,0x10,stored_cmp);
  return pvVar1 != (void *)0x0;
}

Assistant:

bool
NaParams::CheckParam (const char* szParamName) const
{
  item_t	it, *pit;
  it.name = (char*)szParamName;
  it.value = NULL;

  pit = (item_t*)bsearch(&it, storage, stored_n, sizeof(item_t), stored_cmp);
  if(NULL != pit)
    return true;
  return false;
}